

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O2

int __thiscall deqp::egl::MemoryStressCase::init(MemoryStressCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  deUint32 err;
  int extraout_EAX;
  Library *pLVar2;
  EGLDisplay pvVar3;
  NotSupportedError *this_01;
  TestError *this_02;
  allocator<char> local_1bd;
  EGLint configCount;
  EGLint attribList [5];
  undefined1 local_1a0 [384];
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  configCount = 0;
  attribList[0] = 0x3033;
  attribList[1] = 1;
  attribList[2] = 0x3040;
  attribList[3] = 4;
  attribList[4] = 0x3038;
  bVar1 = tcu::CommandLine::isOutOfMemoryTestEnabled
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  if (!bVar1) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"OOM tests disabled",&local_1bd);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pvVar3 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar3;
  (*pLVar2->_vptr_Library[2])(pLVar2,pvVar3,attribList,&this->m_config,1,&configCount);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x177);
  if (configCount != 0) {
    return extraout_EAX;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,(char *)0x0,"configCount != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
             ,0x179);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MemoryStressCase::init (void)
{
	const Library&	egl				= m_eglTestCtx.getLibrary();
	EGLint			configCount		= 0;
	const EGLint	attribList[]	=
	{
		EGL_SURFACE_TYPE,		EGL_PBUFFER_BIT,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	if (!m_testCtx.getCommandLine().isOutOfMemoryTestEnabled())
	{
		m_testCtx.getLog() << TestLog::Message << "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable." << TestLog::EndMessage;
		throw tcu::NotSupportedError("OOM tests disabled");
	}

	m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

	TCU_CHECK(configCount != 0);
}